

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
ansicolor_sink(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this
              )

{
  string *__rhs;
  unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FILE *file;
  bool bVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  key_type local_dc;
  string *local_d8;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  sink::sink(&this->super_sink);
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_00208ca8;
  local_b0 = &this->reset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"\x1b[m",(allocator<char> *)&local_100);
  __rhs = &this->bold;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__rhs,"\x1b[1m",(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->dark,"\x1b[2m",(allocator<char> *)&local_100);
  local_38 = &this->dark;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->underline,"\x1b[4m",(allocator<char> *)&local_100);
  local_40 = &this->underline;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->blink,"\x1b[5m",(allocator<char> *)&local_100);
  local_48 = &this->blink;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->reverse,"\x1b[7m",(allocator<char> *)&local_100);
  local_58 = &this->concealed;
  local_50 = &this->reverse;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"\x1b[8m",(allocator<char> *)&local_100);
  local_60 = &this->clear_line;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"\x1b[K",(allocator<char> *)&local_100);
  local_68 = &this->black;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"\x1b[30m",(allocator<char> *)&local_100);
  local_c0 = &this->red;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"\x1b[31m",(allocator<char> *)&local_100);
  local_b8 = &this->green;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"\x1b[32m",(allocator<char> *)&local_100);
  local_c8 = &this->yellow;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"\x1b[33m",(allocator<char> *)&local_100);
  local_70 = &this->blue;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"\x1b[34m",(allocator<char> *)&local_100);
  local_78 = &this->magenta;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"\x1b[35m",(allocator<char> *)&local_100);
  local_d0 = &this->cyan;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"\x1b[36m",(allocator<char> *)&local_100);
  local_d8 = &this->white;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"\x1b[37m",(allocator<char> *)&local_100);
  local_80 = &this->on_black;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"\x1b[40m",(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->on_red,"\x1b[41m",(allocator<char> *)&local_100);
  local_88 = &this->on_green;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"\x1b[42m",(allocator<char> *)&local_100);
  local_90 = &this->on_yellow;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"\x1b[43m",(allocator<char> *)&local_100);
  local_98 = &this->on_blue;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"\x1b[44m",(allocator<char> *)&local_100);
  local_a0 = &this->on_magenta;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"\x1b[45m",(allocator<char> *)&local_100);
  local_a8 = &this->on_cyan;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"\x1b[46m",(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->on_white,"\x1b[47m",(allocator<char> *)&local_100);
  file = _stdout;
  this->target_file_ = _stdout;
  this->mutex_ = (mutex_t *)details::console_mutex::mutex()::s_mutex;
  this_00 = &this->colors_;
  (this->colors_)._M_h._M_buckets = &(this->colors_)._M_h._M_single_bucket;
  (this->colors_)._M_h._M_bucket_count = 1;
  (this->colors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->colors_)._M_h._M_element_count = 0;
  (this->colors_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->colors_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->colors_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = details::os::in_terminal(file);
  if (bVar1) {
    bVar1 = details::os::is_color_terminal();
  }
  else {
    bVar1 = false;
  }
  this->should_do_colors_ = bVar1;
  local_100._M_dataplus._M_p._0_4_ = 0;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_100);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  local_100._M_dataplus._M_p._0_4_ = 1;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_100);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  local_100._M_dataplus._M_p._0_4_ = 2;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_100);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::operator+(&local_100,local_c8,__rhs);
  local_dc = warn;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_dc);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+(&local_100,local_c0,__rhs);
  local_dc = err;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_dc);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+(&local_100,__rhs,&this->on_red);
  local_dc = critical;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_dc);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  local_100._M_dataplus._M_p._0_4_ = 6;
  pmVar2 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_100);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  return;
}

Assistant:

ansicolor_sink()
        : target_file_(TargetStream::stream())
        , mutex_(ConsoleMutex::mutex())

    {
        should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
        colors_[level::trace] = white;
        colors_[level::debug] = cyan;
        colors_[level::info] = green;
        colors_[level::warn] = yellow + bold;
        colors_[level::err] = red + bold;
        colors_[level::critical] = bold + on_red;
        colors_[level::off] = reset;
    }